

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void clunk::ClearSlide(int from,int dir)

{
  int iVar1;
  int dir_local;
  int from_local;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x304,"void clunk::ClearSlide(const int, const int)");
  }
  if ((undefined *)(&_board)[from] < _FIRST_SLIDER) {
    __assert_fail("_board[from] >= _FIRST_SLIDER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x305,"void clunk::ClearSlide(const int, const int)");
  }
  if (*(byte *)(&_board)[from] < 6 || 0xb < *(byte *)(&_board)[from]) {
    __assert_fail("IS_SLIDER(_board[from]->type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x306,"void clunk::ClearSlide(const int, const int)");
  }
  if ((uint)*(byte *)((&_board)[from] + 1) == from) {
    iVar1 = DirShift(dir);
    *(ulong *)(_atk + (long)(from + 8) * 8) =
         (0xffL << ((byte)iVar1 & 0x3f) ^ 0xffffffffffffffffU) &
         *(ulong *)(_atk + (long)(from + 8) * 8);
    return;
  }
  __assert_fail("_board[from]->sqr == from",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x307,"void clunk::ClearSlide(const int, const int)");
}

Assistant:

inline void ClearSlide(const int from, const int dir) {
  assert(IS_SQUARE(from));
  assert(_board[from] >= _FIRST_SLIDER);
  assert(IS_SLIDER(_board[from]->type));
  assert(_board[from]->sqr == from);
  _atk[from + 8] &= ~(0xFFULL << DirShift(dir));
}